

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.h
# Opt level: O2

quicly_sent_t * quicly_sentmap_allocate(quicly_sentmap_t *map,quicly_sent_acked_cb acked)

{
  st_quicly_sent_block_t *psVar1;
  size_t sVar2;
  
  psVar1 = map->tail;
  if ((psVar1 == (st_quicly_sent_block_t *)0x0) || (sVar2 = psVar1->next_insert_at, sVar2 == 0x10))
  {
    psVar1 = quicly_sentmap__new_block(map);
    if (psVar1 == (st_quicly_sent_block_t *)0x0) {
      return (quicly_sent_t *)0x0;
    }
    sVar2 = psVar1->next_insert_at;
  }
  psVar1->next_insert_at = sVar2 + 1;
  psVar1->num_entries = psVar1->num_entries + 1;
  psVar1->entries[sVar2].acked = acked;
  return psVar1->entries + sVar2;
}

Assistant:

inline quicly_sent_t *quicly_sentmap_allocate(quicly_sentmap_t *map, quicly_sent_acked_cb acked)
{
    struct st_quicly_sent_block_t *block;

    if ((block = map->tail) == NULL || block->next_insert_at == PTLS_ELEMENTSOF(block->entries)) {
        if ((block = quicly_sentmap__new_block(map)) == NULL)
            return NULL;
    }

    quicly_sent_t *sent = block->entries + block->next_insert_at++;
    ++block->num_entries;

    sent->acked = acked;

    return sent;
}